

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_ParseWithLengthOpts
                  (char *value,size_t buffer_length,char **return_parse_end,
                  cJSON_bool require_null_terminated)

{
  cJSON_bool cVar1;
  parse_buffer *ppVar2;
  error local_error;
  cJSON *item;
  parse_buffer buffer;
  cJSON_bool require_null_terminated_local;
  char **return_parse_end_local;
  size_t buffer_length_local;
  char *value_local;
  
  buffer.hooks.reallocate._4_4_ = require_null_terminated;
  memset(&item,0,0x38);
  local_error.position = 0;
  global_error.json = (uchar *)0x0;
  global_error.position = 0;
  if ((value != (char *)0x0) && (buffer_length != 0)) {
    buffer.length = 0;
    buffer.depth = (size_t)global_hooks.allocate;
    buffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
    buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
    item = (cJSON *)value;
    buffer.content = (uchar *)buffer_length;
    local_error.position = (size_t)cJSON_New_Item(&global_hooks);
    if ((cJSON *)local_error.position != (cJSON *)0x0) {
      ppVar2 = skip_utf8_bom((parse_buffer *)&item);
      ppVar2 = buffer_skip_whitespace(ppVar2);
      cVar1 = parse_value((cJSON *)local_error.position,ppVar2);
      if ((cVar1 != 0) &&
         ((buffer.hooks.reallocate._4_4_ == 0 ||
          ((buffer_skip_whitespace((parse_buffer *)&item), buffer.length < buffer.content &&
           (*(char *)((long)&item->next + buffer.length) == '\0')))))) {
        if (return_parse_end == (char **)0x0) {
          return (cJSON *)local_error.position;
        }
        *return_parse_end = (char *)((long)&item->next + buffer.length);
        return (cJSON *)local_error.position;
      }
    }
  }
  if (local_error.position != 0) {
    cJSON_Delete((cJSON *)local_error.position);
  }
  if (value != (char *)0x0) {
    local_error.json = (uchar *)0x0;
    if (buffer.length < buffer.content) {
      local_error.json = (uchar *)buffer.length;
    }
    else if (buffer.content != (uchar *)0x0) {
      local_error.json = buffer.content + -1;
    }
    if (return_parse_end != (char **)0x0) {
      *return_parse_end = value + (long)local_error.json;
    }
    global_error.position = (size_t)local_error.json;
    global_error.json = (uchar *)value;
  }
  return (cJSON *)0x0;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithLengthOpts(const char *value, size_t buffer_length, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    cJSON *item = NULL;

    /* reset error position */
    global_error.json = NULL;
    global_error.position = 0;

    if (value == NULL || 0 == buffer_length)
    {
        goto fail;
    }

    buffer.content = (const unsigned char*)value;
    buffer.length = buffer_length;
    buffer.offset = 0;
    buffer.hooks = global_hooks;

    item = cJSON_New_Item(&global_hooks);
    if (item == NULL) /* memory fail */
    {
        goto fail;
    }

    if (!parse_value(item, buffer_skip_whitespace(skip_utf8_bom(&buffer))))
    {
        /* parse failure. ep is set. */
        goto fail;
    }

    /* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
    if (require_null_terminated)
    {
        buffer_skip_whitespace(&buffer);
        if ((buffer.offset >= buffer.length) || buffer_at_offset(&buffer)[0] != '\0')
        {
            goto fail;
        }
    }
    if (return_parse_end)
    {
        *return_parse_end = (const char*)buffer_at_offset(&buffer);
    }

    return item;

fail:
    if (item != NULL)
    {
        cJSON_Delete(item);
    }

    if (value != NULL)
    {
        error local_error;
        local_error.json = (const unsigned char*)value;
        local_error.position = 0;

        if (buffer.offset < buffer.length)
        {
            local_error.position = buffer.offset;
        }
        else if (buffer.length > 0)
        {
            local_error.position = buffer.length - 1;
        }

        if (return_parse_end != NULL)
        {
            *return_parse_end = (const char*)local_error.json + local_error.position;
        }

        global_error = local_error;
    }

    return NULL;
}